

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::check_flip_flop_always_ff(Generator *top)

{
  undefined1 local_58 [8];
  CheckFlipFlopAlwaysFFVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  CheckFlipFlopAlwaysFFVisitor::CheckFlipFlopAlwaysFFVisitor
            ((CheckFlipFlopAlwaysFFVisitor *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  CheckFlipFlopAlwaysFFVisitor::~CheckFlipFlopAlwaysFFVisitor
            ((CheckFlipFlopAlwaysFFVisitor *)local_58);
  return;
}

Assistant:

void check_flip_flop_always_ff(Generator* top) {
    CheckFlipFlopAlwaysFFVisitor visitor;
    visitor.visit_generator_root_p(top);
}